

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void P_PredictPlayer(player_t *player)

{
  byte *pbVar1;
  ticcmd_t *ptVar2;
  ulong uVar3;
  double dVar4;
  APlayerPawn *pAVar5;
  msecnode_t *pmVar6;
  sector_t *psVar7;
  AActor *pAVar8;
  FBlockNode **ppFVar9;
  FBlockNode *pFVar10;
  ticcmd_t *ptVar11;
  undefined2 uVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  FBlockNode *pFVar22;
  int iVar23;
  double *pdVar24;
  PredictPos *pPVar25;
  msecnode_t *pmVar26;
  uint uVar27;
  bool bVar28;
  bool bVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  PredictPos local_b0;
  PredictPos local_70;
  
  iVar19 = maketic;
  if ((((((!cl_noprediction.Value) && (!singletics)) && (!demoplayback)) &&
       ((player->mo != (APlayerPawn *)0x0 &&
        ((player_t *)(&players + (long)consoleplayer * 0x54) == player)))) &&
      ((player->playerstate == '\0' && ((netgame && ((player->cheats & 0x2000) == 0)))))) &&
     (gametic != maketic)) {
    player_t::operator=(&PredictionPlayerBackup,player);
    pAVar5 = player->mo;
    memcpy(PredictionActorBackup,&(pAVar5->super_AActor).snext,0x508);
    uVar3._0_4_ = (pAVar5->super_AActor).flags;
    uVar3._4_4_ = (pAVar5->super_AActor).flags2;
    (pAVar5->super_AActor).flags = (ActorFlags)(int)(uVar3 & 0xffbffffffffff7ff);
    (pAVar5->super_AActor).flags2 = (ActorFlags2)(int)((uVar3 & 0xffbffffffffff7ff) >> 0x20);
    pbVar1 = (byte *)((long)&player->cheats + 1);
    *pbVar1 = *pbVar1 | 0x20;
    if (PredictionSector_sprev_Backup.Count != 0) {
      PredictionSector_sprev_Backup.Count = 0;
    }
    pmVar6 = (pAVar5->super_AActor).touching_sectorlist;
    if (PredictionTouchingSectorsBackup.Count != 0) {
      PredictionTouchingSectorsBackup.Count = 0;
    }
    for (; pmVar6 != (msecnode_t *)0x0; pmVar6 = pmVar6->m_tnext) {
      TArray<sector_t_*,_sector_t_*>::Grow(&PredictionTouchingSectorsBackup,1);
      psVar7 = pmVar6->m_sector;
      PredictionTouchingSectorsBackup.Array[PredictionTouchingSectorsBackup.Count] = psVar7;
      PredictionTouchingSectorsBackup.Count = PredictionTouchingSectorsBackup.Count + 1;
      for (pmVar26 = psVar7->touching_thinglist; pmVar26 != (msecnode_t *)0x0;
          pmVar26 = pmVar26->m_snext) {
        if ((APlayerPawn *)pmVar26->m_thing == pAVar5) {
          TArray<msecnode_t_*,_msecnode_t_*>::Grow(&PredictionSector_sprev_Backup,1);
          PredictionSector_sprev_Backup.Array[PredictionSector_sprev_Backup.Count] =
               pmVar26->m_sprev;
          PredictionSector_sprev_Backup.Count = PredictionSector_sprev_Backup.Count + 1;
          break;
        }
      }
    }
    if (PredictionSectorListBackup.Count != 0) {
      PredictionSectorListBackup.Count = 0;
    }
    if (((pAVar5->super_AActor).flags.Value & 8) == 0) {
      for (pAVar8 = ((pAVar5->super_AActor).Sector)->thinglist; pAVar8 != (AActor *)0x0;
          pAVar8 = pAVar8->snext) {
        TArray<AActor_*,_AActor_*>::Grow(&PredictionSectorListBackup,1);
        PredictionSectorListBackup.Array[PredictionSectorListBackup.Count] = pAVar8;
        PredictionSectorListBackup.Count = PredictionSectorListBackup.Count + 1;
      }
    }
    for (pFVar22 = (pAVar5->super_AActor).BlockNode; pFVar22 != (FBlockNode *)0x0;
        pFVar22 = pFVar22->NextBlock) {
      ppFVar9 = pFVar22->PrevActor;
      pFVar10 = pFVar22->NextActor;
      if (pFVar10 != (FBlockNode *)0x0) {
        pFVar10->PrevActor = ppFVar9;
      }
      *ppFVar9 = pFVar10;
    }
    (pAVar5->super_AActor).BlockNode = (FBlockNode *)0x0;
    bVar21 = 0.01 <= cl_predict_lerpscale.Value;
    bVar28 = ticdup == 1;
    bVar20 = R_GetViewInterpolationStatus();
    if (gametic < iVar19) {
      bVar29 = false;
      uVar27 = gametic;
      do {
        if (!bVar20) {
          R_RebuildViewInterpolation(player);
        }
        iVar23 = (int)uVar27 % 0xb4;
        uVar12 = *(undefined2 *)&localcmds[iVar23].field_0x12;
        (player->cmd).consistancy = localcmds[iVar23].consistancy;
        *(undefined2 *)&(player->cmd).field_0x12 = uVar12;
        ptVar2 = localcmds + iVar23;
        sVar13 = (ptVar2->ucmd).pitch;
        sVar14 = (ptVar2->ucmd).yaw;
        ptVar11 = localcmds + iVar23;
        sVar15 = (ptVar11->ucmd).roll;
        sVar16 = (ptVar11->ucmd).forwardmove;
        sVar17 = (ptVar11->ucmd).sidemove;
        sVar18 = (ptVar11->ucmd).upmove;
        (player->cmd).ucmd.buttons = (ptVar2->ucmd).buttons;
        (player->cmd).ucmd.pitch = sVar13;
        (player->cmd).ucmd.yaw = sVar14;
        (player->cmd).ucmd.roll = sVar15;
        (player->cmd).ucmd.forwardmove = sVar16;
        (player->cmd).ucmd.sidemove = sVar17;
        (player->cmd).ucmd.upmove = sVar18;
        P_PlayerThink(player);
        (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[7])();
        if ((uVar27 == _ZL14PredictionLast_0 && 0 < (int)_ZL14PredictionLast_0) &&
            (!bVar20 && (bVar28 && bVar21))) {
          pAVar5 = player->mo;
          dVar4 = (pAVar5->super_AActor).__Pos.X;
          bVar29 = true;
          if ((int)_ZL14PredictionLast_1 == (int)dVar4) {
            bVar29 = (int)_ZL14PredictionLast_2 != (int)(pAVar5->super_AActor).__Pos.Y;
          }
          if ((2 < developer.Value) && (bVar29)) {
            DPrintf(3,"Lerp! Ltic (%d) && Ptic (%d) | Lx (%f) && Px (%f) | Ly (%f) && Py (%f)\n",
                    SUB84(_ZL14PredictionLast_1,0),dVar4,_ZL14PredictionLast_2,
                    (pAVar5->super_AActor).__Pos.Y,(ulong)uVar27,(ulong)uVar27);
            bVar29 = true;
          }
        }
        uVar27 = uVar27 + 1;
      } while (iVar19 != uVar27);
    }
    else {
      bVar29 = false;
    }
    if (bVar28 && bVar21) {
      if (bVar20) {
        PredictionLerptics = 0;
        PredictionLerpResult.gametic = 0;
        _ZL18PredictionLerpFrom_0 = 0;
      }
      else if (bVar29) {
        pPVar25 = &PredictionLerpResult;
        uVar30 = 0;
        uVar31 = 0;
        bVar21 = PredictionLerptics == 0;
        if (bVar21) {
          pPVar25 = (PredictPos *)&_ZL14PredictionLast_0;
        }
        _ZL18PredictionLerpFrom_0 = pPVar25->gametic;
        pdVar24 = &PredictionLerpResult.pos.Z;
        if (bVar21) {
          pdVar24 = &_ZL14PredictionLast_3;
        }
        _ZL18PredictionLerpFrom_3 = *pdVar24;
        pdVar24 = &PredictionLerpResult.pos.Y;
        if (bVar21) {
          pdVar24 = &_ZL14PredictionLast_2;
        }
        _ZL18PredictionLerpFrom_2 = *pdVar24;
        pdVar24 = &PredictionLerpResult.pos.X;
        if (bVar21) {
          pdVar24 = &_ZL14PredictionLast_1;
        }
        _ZL18PredictionLerpFrom_1 = ((DVector3 *)pdVar24)->X;
        _ZL18PredictionLerpFrom_6.Degrees = 0.0;
        if (!bVar21) {
          _ZL18PredictionLerpFrom_6.Degrees = PredictionLerpResult.angles.Roll.Degrees;
        }
        _ZL18PredictionLerpFrom_5.Degrees = 0.0;
        if (!bVar21) {
          uVar30 = SUB84(PredictionLerpResult.angles.Pitch.Degrees,0);
          uVar31 = (undefined4)((ulong)PredictionLerpResult.angles.Pitch.Degrees >> 0x20);
          _ZL18PredictionLerpFrom_5.Degrees = PredictionLerpResult.angles.Yaw.Degrees;
        }
        _ZL18PredictionLerpFrom_4 = (double)CONCAT44(uVar31,uVar30);
        PredictionLerptics = 1;
      }
      _ZL14PredictionLast_0 = iVar19 - 1;
      pAVar5 = player->mo;
      _ZL14PredictionLast_1 = (pAVar5->super_AActor).__Pos.X;
      _ZL14PredictionLast_2 = (pAVar5->super_AActor).__Pos.Y;
      _ZL14PredictionLast_3 = (pAVar5->super_AActor).__Pos.Z;
      if (0 < PredictionLerptics) {
        if (0 < _ZL18PredictionLerpFrom_0) {
          local_70.gametic = _ZL18PredictionLerpFrom_0;
          local_70.pos.X = _ZL18PredictionLerpFrom_1;
          local_70.pos.Y = _ZL18PredictionLerpFrom_2;
          local_70.pos.Z = _ZL18PredictionLerpFrom_3;
          local_70.angles.Pitch.Degrees = _ZL18PredictionLerpFrom_4;
          local_70.angles.Yaw.Degrees = _ZL18PredictionLerpFrom_5.Degrees;
          local_70.angles.Roll.Degrees = _ZL18PredictionLerpFrom_6.Degrees;
          local_b0.angles.Pitch.Degrees = 0.0;
          local_b0.angles.Yaw.Degrees = 0.0;
          local_b0.angles.Roll.Degrees = 0.0;
          local_b0.gametic = _ZL14PredictionLast_0;
          local_b0.pos.X = _ZL14PredictionLast_1;
          local_b0.pos.Y = _ZL14PredictionLast_2;
          local_b0.pos.Z = _ZL14PredictionLast_3;
          bVar21 = P_LerpCalculate(&pAVar5->super_AActor,&local_70,&local_b0,&PredictionLerpResult,
                                   (float)PredictionLerptics * cl_predict_lerpscale.Value);
          if (bVar21) {
            PredictionLerptics = PredictionLerptics + 1;
            pAVar5 = player->mo;
            (pAVar5->super_AActor).__Pos.Z = PredictionLerpResult.pos.Z;
            dVar4 = PredictionLerpResult.pos.Y;
            (pAVar5->super_AActor).__Pos.X = PredictionLerpResult.pos.X;
            (pAVar5->super_AActor).__Pos.Y = dVar4;
            return;
          }
        }
        PredictionLerptics = 0;
      }
    }
  }
  return;
}

Assistant:

void P_PredictPlayer (player_t *player)
{
	int maxtic;

	if (cl_noprediction ||
		singletics ||
		demoplayback ||
		player->mo == NULL ||
		player != &players[consoleplayer] ||
		player->playerstate != PST_LIVE ||
		!netgame ||
		/*player->morphTics ||*/
		(player->cheats & CF_PREDICTING))
	{
		return;
	}

	maxtic = maketic;

	if (gametic == maxtic)
	{
		return;
	}

	// Save original values for restoration later
	PredictionPlayerBackup = *player;

	APlayerPawn *act = player->mo;
	memcpy(PredictionActorBackup, &act->snext, sizeof(APlayerPawn) - ((BYTE *)&act->snext - (BYTE *)act));

	act->flags &= ~MF_PICKUP;
	act->flags2 &= ~MF2_PUSHWALL;
	player->cheats |= CF_PREDICTING;

	// The ordering of the touching_sectorlist needs to remain unchanged
	// Also store a copy of all previous sector_thinglist nodes
	msecnode_t *mnode = act->touching_sectorlist;
	msecnode_t *snode;
	PredictionSector_sprev_Backup.Clear();
	PredictionTouchingSectorsBackup.Clear ();

	while (mnode != NULL)
	{
		PredictionTouchingSectorsBackup.Push (mnode->m_sector);

		for (snode = mnode->m_sector->touching_thinglist; snode; snode = snode->m_snext)
		{
			if (snode->m_thing == act)
			{
				PredictionSector_sprev_Backup.Push(snode->m_sprev);
				break;
			}
		}

		mnode = mnode->m_tnext;
	}

	// Keep an ordered list off all actors in the linked sector.
	PredictionSectorListBackup.Clear();
	if (!(act->flags & MF_NOSECTOR))
	{
		AActor *link = act->Sector->thinglist;
		
		while (link != NULL)
		{
			PredictionSectorListBackup.Push(link);
			link = link->snext;
		}
	}

	// Blockmap ordering also needs to stay the same, so unlink the block nodes
	// without releasing them. (They will be used again in P_UnpredictPlayer).
	FBlockNode *block = act->BlockNode;

	while (block != NULL)
	{
		if (block->NextActor != NULL)
		{
			block->NextActor->PrevActor = block->PrevActor;
		}
		*(block->PrevActor) = block->NextActor;
		block = block->NextBlock;
	}
	act->BlockNode = NULL;

	// Values too small to be usable for lerping can be considered "off".
	bool CanLerp = (!(cl_predict_lerpscale < 0.01f) && (ticdup == 1)), DoLerp = false, NoInterpolateOld = R_GetViewInterpolationStatus();
	for (int i = gametic; i < maxtic; ++i)
	{
		if (!NoInterpolateOld)
			R_RebuildViewInterpolation(player);

		player->cmd = localcmds[i % LOCALCMDTICS];
		P_PlayerThink (player);
		player->mo->Tick ();

		if (CanLerp && PredictionLast.gametic > 0 && i == PredictionLast.gametic && !NoInterpolateOld)
		{
			// Z is not compared as lifts will alter this with no apparent change
			// Make lerping less picky by only testing whole units
			DoLerp = (int)PredictionLast.pos.X != (int)player->mo->X() || (int)PredictionLast.pos.Y != (int)player->mo->Y();

			// Aditional Debug information
			if (developer >= DMSG_NOTIFY && DoLerp)
			{
				DPrintf(DMSG_NOTIFY, "Lerp! Ltic (%d) && Ptic (%d) | Lx (%f) && Px (%f) | Ly (%f) && Py (%f)\n",
					PredictionLast.gametic, i,
					(PredictionLast.pos.X), (player->mo->X()),
					(PredictionLast.pos.Y), (player->mo->Y()));
			}
		}
	}

	if (CanLerp)
	{
		if (NoInterpolateOld)
			P_PredictionLerpReset();

		else if (DoLerp)
		{
			// If lerping is already in effect, use the previous camera postion so the view doesn't suddenly snap
			PredictionLerpFrom = (PredictionLerptics == 0) ? PredictionLast : PredictionLerpResult;
			PredictionLerptics = 1;
		}

		PredictionLast.gametic = maxtic - 1;
		PredictionLast.pos = player->mo->Pos();
		//PredictionLast.portalgroup = player->mo->Sector->PortalGroup;

		if (PredictionLerptics > 0)
		{
			if (PredictionLerpFrom.gametic > 0 &&
				P_LerpCalculate(player->mo, PredictionLerpFrom, PredictionLast, PredictionLerpResult, (float)PredictionLerptics * cl_predict_lerpscale))
			{
				PredictionLerptics++;
				player->mo->SetXYZ(PredictionLerpResult.pos);
			}
			else
			{
				PredictionLerptics = 0;
			}
		}
	}
}